

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestTestHandler.cxx
# Opt level: O3

bool anon_unknown.dwarf_7f56f::cmCTestSubdirCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  pointer pbVar1;
  bool bVar2;
  pointer in_name;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  string fname;
  string cwd;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_110;
  size_type local_108;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_100;
  string local_f0;
  basic_string_view<char,_std::char_traits<char>_> local_d0;
  long local_c0;
  undefined1 *local_b8;
  size_type local_b0;
  pointer local_a8;
  long *local_a0;
  size_t local_98;
  long local_90 [2];
  string local_80;
  undefined8 local_60;
  undefined1 *local_58;
  undefined1 local_50 [32];
  
  if ((args->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start ==
      (args->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    local_d0._M_len = (size_t)&local_c0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_d0,"called with incorrect number of arguments","");
    std::__cxx11::string::_M_assign((string *)&status->Error);
    if ((long *)local_d0._M_len != &local_c0) {
      operator_delete((void *)local_d0._M_len,local_c0 + 1);
    }
    bVar2 = false;
  }
  else {
    cmSystemTools::GetCurrentWorkingDirectory_abi_cxx11_();
    in_name = (args->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    pbVar1 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    if (in_name == pbVar1) {
      bVar2 = true;
    }
    else {
      do {
        local_108 = 0;
        local_100._M_local_buf[0] = '\0';
        local_110 = &local_100;
        bVar2 = cmsys::SystemTools::FileIsFullPath(in_name);
        if (bVar2) {
          std::__cxx11::string::_M_assign((string *)&local_110);
        }
        else {
          local_60 = 1;
          local_b8 = local_50;
          local_50[0] = 0x2f;
          local_d0._M_len = local_98;
          local_d0._M_str = (char *)local_a0;
          local_c0 = 1;
          local_a8 = (in_name->_M_dataplus)._M_p;
          local_b0 = in_name->_M_string_length;
          views._M_len = 3;
          views._M_array = &local_d0;
          local_58 = local_b8;
          cmCatViews_abi_cxx11_(&local_80,views);
          std::__cxx11::string::operator=((string *)&local_110,(string *)&local_80);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_80._M_dataplus._M_p != &local_80.field_2) {
            operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
          }
        }
        if (local_110 == &local_100) {
          local_f0.field_2._8_8_ = local_100._8_8_;
          local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
        }
        else {
          local_f0._M_dataplus._M_p = (pointer)local_110;
        }
        local_f0.field_2._M_allocated_capacity._1_7_ = local_100._M_allocated_capacity._1_7_;
        local_f0.field_2._M_local_buf[0] = local_100._M_local_buf[0];
        local_f0._M_string_length = local_108;
        local_108 = 0;
        local_100._M_local_buf[0] = '\0';
        local_110 = &local_100;
        bVar2 = ReadSubdirectory(&local_f0,status);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
          operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
        }
        if (local_110 != &local_100) {
          operator_delete(local_110,
                          CONCAT71(local_100._M_allocated_capacity._1_7_,local_100._M_local_buf[0])
                          + 1);
        }
        in_name = in_name + 1;
      } while (bVar2 && in_name != pbVar1);
    }
    if (local_a0 != local_90) {
      operator_delete(local_a0,local_90[0] + 1);
    }
  }
  return bVar2;
}

Assistant:

bool cmCTestSubdirCommand(std::vector<std::string> const& args,
                          cmExecutionStatus& status)
{
  if (args.empty()) {
    status.SetError("called with incorrect number of arguments");
    return false;
  }
  std::string cwd = cmSystemTools::GetCurrentWorkingDirectory();
  for (std::string const& arg : args) {
    std::string fname;

    if (cmSystemTools::FileIsFullPath(arg)) {
      fname = arg;
    } else {
      fname = cmStrCat(cwd, '/', arg);
    }

    if (!ReadSubdirectory(std::move(fname), status)) {
      return false;
    }
  }
  return true;
}